

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deSharedPtr.hpp
# Opt level: O3

void __thiscall
deqp::gls::ShaderPerformanceCase::setCalibrationInitialParamStorage
          (ShaderPerformanceCase *this,
          SharedPtr<deqp::gls::ShaderPerformanceCase::InitialCalibration> *storage)

{
  deInt32 *pdVar1;
  SharedPtrStateBase *pSVar2;
  SharedPtrStateBase *pSVar3;
  
  pSVar2 = (this->m_initialCalibration).m_state;
  pSVar3 = storage->m_state;
  if (pSVar2 != pSVar3) {
    if (pSVar2 != (SharedPtrStateBase *)0x0) {
      LOCK();
      pdVar1 = &pSVar2->strongRefCount;
      *pdVar1 = *pdVar1 + -1;
      UNLOCK();
      if (*pdVar1 == 0) {
        (this->m_initialCalibration).m_ptr = (InitialCalibration *)0x0;
        (*((this->m_initialCalibration).m_state)->_vptr_SharedPtrStateBase[2])();
      }
      LOCK();
      pdVar1 = &((this->m_initialCalibration).m_state)->weakRefCount;
      *pdVar1 = *pdVar1 + -1;
      UNLOCK();
      if (*pdVar1 == 0) {
        pSVar2 = (this->m_initialCalibration).m_state;
        if (pSVar2 != (SharedPtrStateBase *)0x0) {
          (*pSVar2->_vptr_SharedPtrStateBase[1])();
        }
        (this->m_initialCalibration).m_state = (SharedPtrStateBase *)0x0;
      }
      pSVar3 = storage->m_state;
    }
    (this->m_initialCalibration).m_ptr = storage->m_ptr;
    (this->m_initialCalibration).m_state = pSVar3;
    if (pSVar3 != (SharedPtrStateBase *)0x0) {
      LOCK();
      pSVar3->strongRefCount = pSVar3->strongRefCount + 1;
      UNLOCK();
      LOCK();
      pdVar1 = &((this->m_initialCalibration).m_state)->weakRefCount;
      *pdVar1 = *pdVar1 + 1;
      UNLOCK();
    }
  }
  return;
}

Assistant:

inline SharedPtr<T>& SharedPtr<T>::operator= (const SharedPtr<T>& other)
{
	if (m_state == other.m_state)
		return *this;

	// Release current reference.
	release();

	// Copy from other and acquire reference.
	m_ptr	= other.m_ptr;
	m_state	= other.m_state;

	acquire();

	return *this;
}